

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetPlanePolygonBufferEXT
                   (XrPlaneDetectorEXT planeDetector,uint64_t planeId,uint32_t polygonBufferIndex,
                   XrPlaneDetectorPolygonBufferEXT *polygonBuffer)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_3f1;
  string local_3f0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3d0;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_318;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  GenValidUsageXrInstanceInfo *local_2b0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_planedetectorext_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrPlaneDetectorEXT_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrPlaneDetectorPolygonBufferEXT *polygonBuffer_local;
  uint32_t polygonBufferIndex_local;
  uint64_t planeId_local;
  XrPlaneDetectorEXT planeDetector_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  planeId_local = (uint64_t)planeDetector;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_PLANE_DETECTOR_EXT;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrPlaneDetectorEXT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,(XrPlaneDetectorEXT_T **)&planeId_local,&local_54);
  VVar1 = VerifyXrPlaneDetectorEXTHandle((XrPlaneDetectorEXT *)&planeId_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrPlaneDetectorEXT_T_*>::getWithInstanceInfo
                      (&g_planedetectorext_info,(XrPlaneDetectorEXT_T *)planeId_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2b0 = pGVar2;
    gen_planedetectorext_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (polygonBuffer == (XrPlaneDetectorPolygonBufferEXT *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d0,"VUID-xrGetPlanePolygonBufferEXT-polygonBuffer-parameter",&local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"xrGetPlanePolygonBufferEXT",&local_2f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_318,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_338,
                 "Invalid NULL for XrPlaneDetectorPolygonBufferEXT \"polygonBuffer\" which is not optional and must be non-NULL"
                 ,&local_339);
      CoreValidLogMessage(pGVar2,(string *)local_2d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f8,&local_318,(string *)local_338);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_318);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      planeDetector_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360,"xrGetPlanePolygonBufferEXT",&local_361);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_360,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_50,false,true,polygonBuffer);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
      pGVar2 = local_2b0;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        planeDetector_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_388,"VUID-xrGetPlanePolygonBufferEXT-polygonBuffer-parameter",&local_389);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b0,"xrGetPlanePolygonBufferEXT",&local_3b1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3d0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3f0,"Command xrGetPlanePolygonBufferEXT param polygonBuffer is invalid",
                   &local_3f1);
        CoreValidLogMessage(pGVar2,(string *)local_388,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3b0,&local_3d0,(string *)local_3f0);
        std::__cxx11::string::~string(local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3d0);
        std::__cxx11::string::~string(local_3b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
        std::__cxx11::string::~string(local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        planeDetector_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,"Invalid XrPlaneDetectorEXT handle \"planeDetector\" ");
    HandleToHexString<XrPlaneDetectorEXT_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,"VUID-xrGetPlanePolygonBufferEXT-planeDetector-parameter",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"xrGetPlanePolygonBufferEXT",&local_249);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    planeDetector_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return planeDetector_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetPlanePolygonBufferEXT(
XrPlaneDetectorEXT planeDetector,
uint64_t planeId,
uint32_t polygonBufferIndex,
XrPlaneDetectorPolygonBufferEXT* polygonBuffer) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(planeDetector, XR_OBJECT_TYPE_PLANE_DETECTOR_EXT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrPlaneDetectorEXTHandle(&planeDetector);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrPlaneDetectorEXT handle \"planeDetector\" ";
                oss << HandleToHexString(planeDetector);
                CoreValidLogMessage(nullptr, "VUID-xrGetPlanePolygonBufferEXT-planeDetector-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetPlanePolygonBufferEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_planedetectorext_info.getWithInstanceInfo(planeDetector);
        GenValidUsageXrHandleInfo *gen_planedetectorext_info = info_with_instance.first;
        (void)gen_planedetectorext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == polygonBuffer) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetPlanePolygonBufferEXT-polygonBuffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetPlanePolygonBufferEXT", objects_info,
                                "Invalid NULL for XrPlaneDetectorPolygonBufferEXT \"polygonBuffer\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrPlaneDetectorPolygonBufferEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetPlanePolygonBufferEXT", objects_info,
                                                        false, true, polygonBuffer);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetPlanePolygonBufferEXT-polygonBuffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetPlanePolygonBufferEXT",
                                objects_info,
                                "Command xrGetPlanePolygonBufferEXT param polygonBuffer is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}